

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Room.cpp
# Opt level: O2

void __thiscall Room::parseData(Room *this)

{
  int iVar1;
  char cVar2;
  bool bVar3;
  istream *piVar4;
  int iVar5;
  string line;
  ifstream myfile;
  
  std::ifstream::ifstream(&myfile,(string *)&this->roomName,_S_in);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    iVar1 = 0;
    while( true ) {
      iVar5 = iVar1;
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&myfile,(string *)&line);
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
      bVar3 = std::operator==(&line,"#ROOM_STATE_1#");
      iVar1 = 1;
      if (!bVar3) {
        bVar3 = std::operator==(&line,"#ROOM_STATE_2#");
        iVar1 = 2;
        if (!bVar3) {
          if (iVar5 == 1) {
            std::__cxx11::string::append((string *)&this->rstate1);
            std::__cxx11::string::append((char *)&this->rstate1);
            iVar1 = 1;
          }
          else if (iVar5 == 0) {
            std::__cxx11::string::append((string *)&this->rstate0);
            std::__cxx11::string::append((char *)&this->rstate0);
            iVar1 = 0;
          }
          else {
            std::__cxx11::string::append((string *)&this->rstate2);
            std::__cxx11::string::append((char *)&this->rstate2);
            iVar1 = 2;
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&line);
  }
  std::ifstream::close();
  std::ifstream::~ifstream(&myfile);
  return;
}

Assistant:

void Room::parseData() {
    std::ifstream myfile(roomName);
    description description = ROOM_STATE_0;
    if (myfile.is_open()) {
        std::string line;
        while (getline(myfile, line)) {
            if (line == "#ROOM_STATE_1#") {
                description = ROOM_STATE_1;
            } else if (line == "#ROOM_STATE_2#") {
                description = ROOM_STATE_2;
            } else if (description == ROOM_STATE_0) {
                rstate0 += line;
                rstate0 += "\n";
            } else if (description == ROOM_STATE_1) {
                rstate1 += line;
                rstate1 += "\n";
            } else if(description == ROOM_STATE_2) {
                rstate2 += line;
                rstate2 += "\n";
            }
        }
    }
    myfile.close();
}